

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall
Tokenizer::registerReplacementInteger(Tokenizer *this,Identifier *identifier,int64_t newValue)

{
  Replacement replacement;
  Token tok;
  int64_t local_e8;
  value_type local_e0;
  string local_a8;
  Token local_88;
  
  local_88.originalText._M_dataplus._M_p = (pointer)&local_88.originalText.field_2;
  local_88.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_index =
       '\0';
  local_88.line = 0;
  local_88.column._0_5_ = 0;
  local_88.column._5_3_ = 0;
  local_88.checked = false;
  local_88.originalText._M_string_length = 0;
  local_88.originalText.field_2._M_local_buf[0] = '\0';
  local_88.type = Integer;
  local_e8 = newValue;
  tinyformat::format<long>(&local_a8,"%d",&local_e8);
  Token::setValue<long>(&local_88,newValue,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  local_e0.identifier._name._M_dataplus._M_p = (pointer)&local_e0.identifier._name.field_2;
  local_e0.identifier._name._M_string_length = 0;
  local_e0.identifier._name.field_2._M_local_buf[0] = '\0';
  local_e0.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&local_e0);
  std::vector<Token,_std::allocator<Token>_>::push_back(&local_e0.value,&local_88);
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::push_back
            (&this->replacements,&local_e0);
  Replacement::~Replacement(&local_e0);
  Token::~Token(&local_88);
  return;
}

Assistant:

void Tokenizer::registerReplacementInteger(const Identifier& identifier, int64_t newValue)
{
	Token tok;
	tok.type = TokenType::Integer;
	tok.setValue(newValue, tfm::format("%d", newValue));

	Replacement replacement;
	replacement.identifier = identifier;
	replacement.value.push_back(tok);

	replacements.push_back(replacement);
}